

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O2

void libtorrent::aux::delete_files
               (file_storage *fs,string *save_path,string *part_file_name,remove_flags_t options,
               storage_error *ec)

{
  _Base_ptr p_Var1;
  bool bVar2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  uint uVar6;
  file_index_t index;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar7;
  string *psVar8;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string_view lhs;
  string_view lhs_00;
  string_view lhs_01;
  string_view rhs;
  string_view rhs_00;
  string_view rhs_01;
  string fp;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_c8;
  string p;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  string bp;
  string local_50;
  
  if ((options.m_val & 1) == 0) {
    if ((options.m_val & 2) == 0) {
      return;
    }
  }
  else {
    directories._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &directories._M_t._M_impl.super__Rb_tree_header._M_header;
    directories._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    directories._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    directories._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    psVar8 = part_file_name;
    directories._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         directories._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar3 = file_storage::file_range(fs);
    iVar7 = iVar3;
    while( true ) {
      p_Var1 = directories._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_c8 = iVar3._end.m_val;
      index.m_val = (int)iVar7._begin.m_val;
      if (index.m_val == local_c8.m_val) break;
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&p,"",(allocator<char> *)&bp);
      file_storage::file_path(&fp,fs,index,&p);
      ::std::__cxx11::string::~string((string *)&p);
      bVar2 = file_storage::file_absolute_path(fs,index);
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&p,(string *)&fp);
      }
      else {
        rhs._M_len._4_4_ = fp._M_dataplus._M_p._4_4_;
        rhs._M_len._0_4_ = fp._M_dataplus._M_p._0_4_;
        lhs._M_str = (char *)fp._M_string_length;
        lhs._M_len = (size_t)(save_path->_M_dataplus)._M_p;
        rhs._M_str = (char *)psVar8;
        combine_path_abi_cxx11_(&p,(libtorrent *)save_path->_M_string_length,lhs,rhs);
        parent_path(&bp,&fp);
        uVar6 = 1;
        while (((uVar6 & 1) != 0 && (bp._M_string_length != 0))) {
          lhs_00._M_str = (char *)bp._M_string_length;
          lhs_00._M_len = (size_t)(save_path->_M_dataplus)._M_p;
          rhs_00._M_str = (char *)psVar8;
          rhs_00._M_len = (size_t)bp._M_dataplus._M_p;
          combine_path_abi_cxx11_(&local_50,(libtorrent *)save_path->_M_string_length,lhs_00,rhs_00)
          ;
          pVar9 = ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&directories,&local_50);
          uVar6 = pVar9._8_4_;
          ::std::__cxx11::string::~string((string *)&local_50);
          parent_path(&local_50,&bp);
          ::std::__cxx11::string::operator=((string *)&bp,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        ::std::__cxx11::string::~string((string *)&bp);
      }
      anon_unknown_25::delete_one_file(&p,&ec->ec);
      if ((ec->ec).val_ != 0) {
        *(short *)&ec->field_0x10 = (short)iVar7._begin.m_val;
        ec->field_0x12 = iVar7._begin.m_val._2_1_;
        ec->operation = file_remove;
      }
      ::std::__cxx11::string::~string((string *)&p);
      ::std::__cxx11::string::~string((string *)&fp);
      iVar7._begin.m_val = index.m_val + 1;
      iVar7._end.m_val = 0;
    }
    for (p_Var5 = &directories._M_t._M_impl.super__Rb_tree_header._M_header; p_Var5 != p_Var1;
        p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var5)) {
      fp._M_dataplus._M_p._0_4_ = 0;
      fp._M_dataplus._M_p._4_4_ = fp._M_dataplus._M_p._4_4_ & 0xffffff00;
      fp._M_string_length =
           (size_type)&boost::system::detail::cat_holder<void>::system_category_instance;
      lVar4 = ::std::_Rb_tree_decrement(p_Var5);
      anon_unknown_25::delete_one_file((string *)(lVar4 + 0x20),(error_code *)&fp);
      if ((fp._M_dataplus._M_p._4_1_ == '\x01') && ((ec->ec).val_ == 0)) {
        *(undefined2 *)&ec->field_0x10 = 0xffff;
        ec->field_0x12 = 0xff;
        (ec->ec).val_ = fp._M_dataplus._M_p._0_4_;
        (ec->ec).failed_ = (bool)(char)fp._M_dataplus._M_p._4_4_;
        *(int3 *)&(ec->ec).field_0x5 = (int3)(fp._M_dataplus._M_p._4_4_ >> 8);
        (ec->ec).cat_ = (error_category *)fp._M_string_length;
        ec->operation = file_remove;
      }
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&directories._M_t);
  }
  fp._M_dataplus._M_p._0_4_ = 0;
  fp._M_dataplus._M_p._4_4_ = fp._M_dataplus._M_p._4_4_ & 0xffffff00;
  fp._M_string_length =
       (size_type)&boost::system::detail::cat_holder<void>::system_category_instance;
  lhs_01._M_str = (char *)part_file_name->_M_string_length;
  lhs_01._M_len = (size_t)(save_path->_M_dataplus)._M_p;
  rhs_01._M_str = (char *)part_file_name;
  rhs_01._M_len = (size_t)(part_file_name->_M_dataplus)._M_p;
  combine_path_abi_cxx11_
            ((string *)&directories,(libtorrent *)save_path->_M_string_length,lhs_01,rhs_01);
  remove((libtorrent *)&directories,(char *)&fp);
  ::std::__cxx11::string::~string((string *)&directories);
  if (fp._M_dataplus._M_p._4_1_ == '\x01') {
    directories._M_t._M_impl._0_16_ =
         boost::system::errc::make_error_condition(no_such_file_or_directory);
    bVar2 = boost::system::operator!=((error_code *)&fp,(error_condition *)&directories);
    if (bVar2) {
      *(undefined2 *)&ec->field_0x10 = 0xffff;
      ec->field_0x12 = 0xff;
      (ec->ec).val_ = fp._M_dataplus._M_p._0_4_;
      (ec->ec).failed_ = (bool)(char)fp._M_dataplus._M_p._4_4_;
      *(int3 *)&(ec->ec).field_0x5 = (int3)(fp._M_dataplus._M_p._4_4_ >> 8);
      (ec->ec).cat_ = (error_category *)fp._M_string_length;
      ec->operation = file_remove;
    }
  }
  return;
}

Assistant:

void delete_files(file_storage const& fs, std::string const& save_path
		, std::string const& part_file_name, remove_flags_t const options, storage_error& ec)
	{
		if (options & session::delete_files)
		{
			// delete the files from disk
			std::set<std::string> directories;
			using iter_t = std::set<std::string>::iterator;
			for (auto const i : fs.file_range())
			{
				std::string const fp = fs.file_path(i);
				bool const complete = fs.file_absolute_path(i);
				std::string const p = complete ? fp : combine_path(save_path, fp);
				if (!complete)
				{
					std::string bp = parent_path(fp);
					std::pair<iter_t, bool> ret;
					ret.second = true;
					while (ret.second && !bp.empty())
					{
						ret = directories.insert(combine_path(save_path, bp));
						bp = parent_path(bp);
					}
				}
				delete_one_file(p, ec.ec);
				if (ec) { ec.file(i); ec.operation = operation_t::file_remove; }
			}

			// remove the directories. Reverse order to delete
			// subdirectories first

			for (auto i = directories.rbegin()
				, end(directories.rend()); i != end; ++i)
			{
				error_code error;
				delete_one_file(*i, error);
				if (error && !ec)
				{
					ec.file(file_index_t(-1));
					ec.ec = error;
					ec.operation = operation_t::file_remove;
				}
			}
		}

		// when we're deleting "files", we also delete the part file
		if ((options & session::delete_partfile)
			|| (options & session::delete_files))
		{
			error_code error;
			remove(combine_path(save_path, part_file_name), error);
			if (error && error != boost::system::errc::no_such_file_or_directory)
			{
				ec.file(file_index_t(-1));
				ec.ec = error;
				ec.operation = operation_t::file_remove;
			}
		}
	}